

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.pb.h
# Opt level: O2

TestField * __thiscall
proto2_unittest::TestDiffMessage_Item::_internal_mutable_m(TestDiffMessage_Item *this)

{
  TestField *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.m_;
  if (pTVar1 != (TestField *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestField *)google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestField>(arena)
  ;
  (this->field_0)._impl_.m_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestField* PROTOBUF_NONNULL TestDiffMessage_Item::_internal_mutable_m() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.m_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestField>(GetArena());
    _impl_.m_ = reinterpret_cast<::proto2_unittest::TestField*>(p);
  }
  return _impl_.m_;
}